

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ImVec2 IVar14;
  double dVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pIVar1 = GImGui;
  uVar5 = (ulong)(flags & 1);
  uVar3 = data_type & 0xfffffffe;
  bVar6 = uVar3 == 4;
  bVar4 = power != 1.0;
  fVar18 = (&(bb->Min).x)[uVar5];
  fVar17 = (&(bb->Max).x)[uVar5];
  fVar20 = (fVar17 - fVar18) + -4.0;
  fVar16 = (GImGui->Style).GrabMinSize;
  dVar15 = v_max - v_min;
  dVar13 = (double)(~-(ulong)(v_min < v_max) & (ulong)(v_min - v_max) |
                   -(ulong)(v_min < v_max) & (ulong)dVar15);
  if ((uVar3 != 4) && (0.0 <= dVar13)) {
    fVar9 = (float)((double)fVar20 / (dVar13 + 1.0));
    uVar7 = -(uint)(fVar16 <= fVar9);
    fVar16 = (float)(~uVar7 & (uint)fVar16 | (uint)fVar9 & uVar7);
  }
  if (fVar20 <= fVar16) {
    fVar16 = fVar20;
  }
  if ((!bVar4 || !bVar6) || 0.0 <= v_min * v_max) {
    if (v_min < 0.0) {
      fVar9 = 1.0;
    }
    else {
      fVar9 = 0.0;
    }
  }
  else {
    uVar8 = -(ulong)(-v_min <= v_min);
    dVar11 = pow((double)(uVar8 & (ulong)v_min | ~uVar8 & (ulong)-v_min),1.0 / (double)power);
    uVar8 = -(ulong)(-v_max <= v_max);
    dVar12 = pow((double)(uVar8 & (ulong)v_max | ~uVar8 & (ulong)-v_max),1.0 / (double)power);
    fVar9 = (float)(dVar11 / (dVar12 + dVar11));
  }
  fVar18 = fVar18 + 2.0 + fVar16 * 0.5;
  if (pIVar1->ActiveId == id) {
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar14 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar20 = IVar14.x;
      if (uVar5 != 0) {
        fVar20 = -IVar14.y;
      }
      if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar20 != 0.0) || (NAN(fVar20))) {
        fVar10 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar9);
        if ((uVar3 != 4) ||
           (iVar2 = ImParseFormatPrecision(format,3), (bool)(~(bVar4 && bVar6) & iVar2 < 1))) {
          if ((ABS(dVar13) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar20 = *(float *)(&DAT_001930a8 + (ulong)(fVar20 < 0.0) * 4) / (float)dVar13;
          }
          else {
            fVar20 = fVar20 / 100.0;
          }
        }
        else {
          fVar20 = fVar20 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar20 = fVar20 / 10.0;
          }
        }
        uVar7 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar20 = (float)(~uVar7 & (uint)fVar20 | (uint)(fVar20 * 10.0) & uVar7);
        if (((fVar10 < 1.0) || (fVar20 <= 0.0)) && ((0.0 < fVar10 || (0.0 <= fVar20)))) {
          fVar10 = fVar10 + fVar20;
          fVar19 = 1.0;
          if (fVar10 <= 1.0) {
            fVar19 = fVar10;
          }
          fVar19 = (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar19);
          goto LAB_00157327;
        }
        goto LAB_0015750b;
      }
      bVar4 = false;
      goto LAB_00157510;
    }
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar1->IO).MouseDown[0] != false) {
        fVar19 = 0.0;
        if (0.0 < fVar20 - fVar16) {
          fVar20 = (*(float *)((pIVar1->IO).MouseDown + uVar5 * 4 + -8) - fVar18) /
                   (fVar20 - fVar16);
          fVar19 = 1.0;
          if (fVar20 <= 1.0) {
            fVar19 = fVar20;
          }
          fVar19 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar19);
        }
        if (uVar5 != 0) {
          fVar19 = 1.0 - fVar19;
        }
LAB_00157327:
        if (bVar4 && bVar6) {
          if (fVar9 <= fVar19) {
            uVar3 = -(uint)(1e-06 < ABS(fVar9 + -1.0));
            fVar20 = powf((float)(~uVar3 & (uint)fVar19 |
                                 (uint)((fVar19 - fVar9) / (1.0 - fVar9)) & uVar3),power);
            dVar13 = (double)(-(ulong)(0.0 <= v_min) & (ulong)v_min);
            dVar13 = (double)fVar20 * (v_max - dVar13) + dVar13;
          }
          else {
            fVar20 = powf(1.0 - fVar19 / fVar9,power);
            dVar13 = v_max;
            if (0.0 <= v_max) {
              dVar13 = 0.0;
            }
            dVar13 = (double)fVar20 * (v_min - dVar13) + dVar13;
          }
        }
        else {
          if (uVar3 == 4) {
            dVar13 = dVar15 * (double)fVar19;
          }
          else {
            dVar15 = dVar15 * (double)fVar19;
            dVar13 = dVar15 + 0.5;
            if (dVar15 + 0.5 <= dVar15) {
              dVar13 = dVar15;
            }
          }
          dVar13 = dVar13 + v_min;
        }
        dVar15 = RoundScalarWithFormatT<double,double>(format,data_type,dVar13);
        if ((*v != dVar15) || (NAN(*v) || NAN(dVar15))) {
          *v = dVar15;
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        goto LAB_00157510;
      }
      ClearActiveID();
    }
  }
LAB_0015750b:
  bVar4 = false;
LAB_00157510:
  fVar20 = SliderCalcRatioFromValueT<double,double>(data_type,*v,v_min,v_max,power,fVar9);
  if (uVar5 != 0) {
    fVar20 = 1.0 - fVar20;
  }
  fVar18 = (((fVar17 + -2.0) - fVar16 * 0.5) - fVar18) * fVar20 + fVar18;
  if (uVar5 == 0) {
    fVar17 = (bb->Min).y + 2.0;
    fVar20 = -fVar16 * 0.5 + fVar18;
    fVar9 = fVar16 * 0.5 + fVar18;
    fVar18 = (bb->Max).y + -2.0;
  }
  else {
    fVar17 = -fVar16 * 0.5 + fVar18;
    fVar20 = (bb->Min).x + 2.0;
    fVar9 = (bb->Max).x + -2.0;
    fVar18 = fVar16 * 0.5 + fVar18;
  }
  (out_grab_bb->Min).x = fVar20;
  (out_grab_bb->Min).y = fVar17;
  (out_grab_bb->Max).x = fVar9;
  (out_grab_bb->Max).y = fVar18;
  return bVar4;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}